

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

yyjson_mut_val * duckdb::ToJSONRecursive(yyjson_mut_doc *doc,ProfilingNode *node)

{
  yyjson_val_pool *pyVar1;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *input;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  ProfilingNode *node_00;
  yyjson_mut_val *pyVar5;
  yyjson_mut_val *pyVar6;
  yyjson_mut_val *dest;
  yyjson_mut_val *pyVar7;
  idx_t i;
  ulong uVar8;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  
  if (doc == (yyjson_mut_doc *)0x0) {
LAB_00454e08:
    dest = (yyjson_mut_val *)0x0;
  }
  else {
    pyVar1 = &doc->val_pool;
    dest = (doc->val_pool).cur;
    if ((doc->val_pool).end == dest) {
      bVar4 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
      if (!bVar4) goto LAB_00454e08;
      dest = pyVar1->cur;
    }
    pyVar1->cur = dest + 1;
    if (dest == (yyjson_mut_val *)0x0) goto LAB_00454e08;
    dest->tag = 7;
  }
  input = &(node->profiling_info).extra_info;
  QueryProfiler::JSONSanitize(&local_80,input);
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=(input,&local_80);
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~InsertionOrderPreservingMap(&local_80);
  ProfilingInfo::WriteMetricsToJSON(&node->profiling_info,doc,dest);
  if (doc != (yyjson_mut_doc *)0x0) {
    pyVar1 = &doc->val_pool;
    pyVar7 = (doc->val_pool).cur;
    if ((doc->val_pool).end == pyVar7) {
      bVar4 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
      if (!bVar4) goto LAB_00454e2b;
      pyVar7 = pyVar1->cur;
    }
    pyVar1->cur = pyVar7 + 1;
    if (pyVar7 != (yyjson_mut_val *)0x0) {
      pyVar7->tag = 6;
      goto LAB_00454c9c;
    }
  }
LAB_00454e2b:
  pyVar7 = (yyjson_mut_val *)0x0;
LAB_00454c9c:
  for (uVar8 = 0;
      uVar8 < (ulong)((long)(node->children).
                            super_vector<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(node->children).
                            super_vector<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    local_80.map.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ProfilingNode::GetChild(node,uVar8);
    node_00 = optional_ptr<duckdb::ProfilingNode,_true>::operator*
                        ((optional_ptr<duckdb::ProfilingNode,_true> *)&local_80);
    pyVar5 = ToJSONRecursive(doc,node_00);
    if (((pyVar7 != (yyjson_mut_val *)0x0) && (pyVar5 != (yyjson_mut_val *)0x0)) &&
       (uVar2 = pyVar7->tag, ((uint)uVar2 & 7) == 6)) {
      pyVar7->tag = (uVar2 & 0xfffffffffffffffe) + 0x100;
      pyVar6 = pyVar5;
      if (0xff < uVar2) {
        pyVar6 = *(yyjson_mut_val **)((pyVar7->uni).u64 + 0x10);
        *(yyjson_mut_val **)((pyVar7->uni).u64 + 0x10) = pyVar5;
      }
      pyVar5->next = pyVar6;
      (pyVar7->uni).str = (char *)pyVar5;
    }
  }
  if (((doc != (yyjson_mut_doc *)0x0) && (dest != (yyjson_mut_val *)0x0)) &&
     ((pyVar7 != (yyjson_mut_val *)0x0 && ((~(uint)dest->tag & 7) == 0)))) {
    pyVar1 = &doc->val_pool;
    pyVar5 = (doc->val_pool).cur;
    if ((ulong)(((long)(doc->val_pool).end - (long)pyVar5) / 0x18) < 2) {
      bVar4 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2);
      if (!bVar4) {
        return dest;
      }
      pyVar5 = pyVar1->cur;
    }
    pyVar1->cur = pyVar5 + 2;
    if (pyVar5 != (yyjson_mut_val *)0x0) {
      uVar8 = dest->tag;
      pyVar5->tag = 0x80d;
      (pyVar5->uni).f64 = (double)"children";
      pyVar6 = pyVar5;
      if (0xff < uVar8) {
        lVar3 = *(long *)((dest->uni).u64 + 0x10);
        pyVar6 = *(yyjson_mut_val **)(lVar3 + 0x10);
        *(yyjson_mut_val **)(lVar3 + 0x10) = pyVar5;
      }
      pyVar7->next = pyVar6;
      pyVar5->next = pyVar7;
      (dest->uni).u64 = (uint64_t)pyVar5;
      dest->tag = (uVar8 & 0xffffffffffffff00) + (ulong)(byte)dest->tag + 0x100;
    }
  }
  return dest;
}

Assistant:

static yyjson_mut_val *ToJSONRecursive(yyjson_mut_doc *doc, ProfilingNode &node) {
	auto result_obj = yyjson_mut_obj(doc);
	auto &profiling_info = node.GetProfilingInfo();
	profiling_info.extra_info = QueryProfiler::JSONSanitize(profiling_info.extra_info);
	profiling_info.WriteMetricsToJSON(doc, result_obj);

	auto children_list = yyjson_mut_arr(doc);
	for (idx_t i = 0; i < node.GetChildCount(); i++) {
		auto child = ToJSONRecursive(doc, *node.GetChild(i));
		yyjson_mut_arr_add_val(children_list, child);
	}
	yyjson_mut_obj_add_val(doc, result_obj, "children", children_list);
	return result_obj;
}